

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

filepos_t MATROSKA_MetaSeekAbsolutePos(matroska_seekpoint *MetaSeek)

{
  filepos_t fVar1;
  ebml_context *Context;
  bool_t bVar2;
  filepos_t fVar3;
  
  fVar1 = MATROSKA_MetaSeekPosInSegment(MetaSeek);
  fVar3 = -1;
  if (fVar1 != -1) {
    do {
      MetaSeek = (matroska_seekpoint *)(MetaSeek->Base).Base.Base.Parent;
      if (MetaSeek == (matroska_seekpoint *)0x0) {
        return -1;
      }
      Context = MATROSKA_getContextSegment();
      bVar2 = EBML_ElementIsType((ebml_element *)MetaSeek,Context);
    } while (bVar2 == 0);
    fVar3 = EBML_ElementPositionData((ebml_element *)MetaSeek);
    fVar3 = fVar3 + fVar1;
  }
  return fVar3;
}

Assistant:

filepos_t MATROSKA_MetaSeekAbsolutePos(const matroska_seekpoint *MetaSeek)
{
    filepos_t RelPos = MATROSKA_MetaSeekPosInSegment(MetaSeek);
    ebml_element *RSegment;
    if (RelPos==INVALID_FILEPOS_T)
        return INVALID_FILEPOS_T;

    RSegment = EBML_ElementParent(MetaSeek);
    while (RSegment && !EBML_ElementIsType(RSegment, MATROSKA_getContextSegment()))
        RSegment = EBML_ElementParent(RSegment);
    if (!RSegment)
        return INVALID_FILEPOS_T;

    return RelPos + EBML_ElementPositionData(RSegment);
}